

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_strategies.cpp
# Opt level: O3

void __thiscall Clasp::BasicSatConfig::BasicSatConfig(BasicSatConfig *this)

{
  undefined1 local_88 [16];
  OptParams local_78;
  uint32 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  ScheduleStrategy local_68;
  ScheduleStrategy local_58;
  ReduceStrategy local_48;
  undefined8 local_44;
  undefined8 local_3c;
  undefined8 uStack_34;
  undefined8 local_2c;
  undefined8 uStack_24;
  undefined4 local_1c;
  
  (this->super_ContextParams).satPre = (SatPreParams)0xfa000000000;
  *(undefined2 *)&(this->super_ContextParams).field_0x8 = 0x44;
  (this->super_UserConfiguration).super_Configuration._vptr_Configuration =
       (_func_int **)&PTR__BasicSatConfig_001e8bd8;
  (this->solver_).ebo_.buf = (pointer)0x0;
  (this->solver_).ebo_.size = 0;
  (this->solver_).ebo_.cap = 0;
  (this->search_).ebo_.buf = (pointer)0x0;
  (this->search_).ebo_.size = 0;
  (this->search_).ebo_.cap = 0;
  (this->heu_).ptr_ = 0;
  local_88._0_8_ = (SolverStrategies)0x0;
  local_88._8_8_ = (HeuParams)0x100000;
  local_78 = (OptParams)0x0;
  uStack_74 = 1;
  uStack_70 = 0;
  bk_lib::pod_vector<Clasp::SolverParams,_std::allocator<Clasp::SolverParams>_>::push_back
            (&this->solver_,(SolverParams *)local_88);
  local_88._0_8_ = (SolverStrategies)0x64;
  local_88._8_8_ = (HeuParams)0x3fc0000000000000;
  local_78 = (OptParams)0x0;
  uStack_74 = 0;
  uStack_70 = 0x26f50000;
  uStack_6c = 0;
  local_68._0_4_ = 0;
  local_68.idx = 0;
  local_68.len = 0;
  local_68.grow = 1.5;
  local_58._0_4_ = 0x40000000;
  local_58.idx = 0;
  local_58.len = 0;
  local_58.grow = 1.5;
  local_48 = (ReduceStrategy)0x25800;
  local_44._0_4_ = 0.33333334;
  local_44._4_4_ = 3.0;
  local_3c._0_4_ = 1.1;
  local_3c._4_4_ = 10;
  uStack_34._0_4_ = 0xffffffff;
  uStack_34._4_4_ = 0xffffffff;
  local_2c._0_4_ = 0;
  local_2c._4_4_ = 0;
  uStack_24._0_4_ = 0.0;
  uStack_24._4_4_ = 0;
  local_1c = 0;
  bk_lib::pod_vector<Clasp::SolveParams,_std::allocator<Clasp::SolveParams>_>::push_back
            (&this->search_,(SolveParams *)local_88);
  return;
}

Assistant:

BasicSatConfig::BasicSatConfig() {
	solver_.push_back(SolverParams());
	search_.push_back(SolveParams());
}